

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PorterStep1B2(char *aBuf,int *pnBuf)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int *in_RSI;
  long in_RDI;
  int nBuf;
  int ret;
  int local_14;
  
  local_14 = 0;
  iVar2 = *in_RSI;
  cVar1 = *(char *)(in_RDI + (iVar2 + -2));
  if (cVar1 == 'a') {
    if ((2 < iVar2) && (iVar3 = memcmp("at",(void *)(in_RDI + (iVar2 + -2)),2), iVar3 == 0)) {
      *(undefined2 *)(in_RDI + (iVar2 + -2)) = 0x7461;
      *(undefined1 *)(in_RDI + 2 + (long)(iVar2 + -2)) = 0x65;
      *in_RSI = iVar2 + 1;
      local_14 = 1;
    }
  }
  else if (cVar1 == 'b') {
    if ((2 < iVar2) && (iVar3 = memcmp("bl",(void *)(in_RDI + (iVar2 + -2)),2), iVar3 == 0)) {
      *(undefined2 *)(in_RDI + (iVar2 + -2)) = 0x6c62;
      *(undefined1 *)(in_RDI + 2 + (long)(iVar2 + -2)) = 0x65;
      *in_RSI = iVar2 + 1;
      local_14 = 1;
    }
  }
  else if (((cVar1 == 'i') && (2 < iVar2)) &&
          (iVar3 = memcmp("iz",(void *)(in_RDI + (iVar2 + -2)),2), iVar3 == 0)) {
    *(undefined2 *)(in_RDI + (iVar2 + -2)) = 0x7a69;
    *(undefined1 *)(in_RDI + 2 + (long)(iVar2 + -2)) = 0x65;
    *in_RSI = iVar2 + 1;
    local_14 = 1;
  }
  return local_14;
}

Assistant:

static int fts5PorterStep1B2(char *aBuf, int *pnBuf){
  int ret = 0;
  int nBuf = *pnBuf;
  switch( aBuf[nBuf-2] ){

    case 'a':
      if( nBuf>2 && 0==memcmp("at", &aBuf[nBuf-2], 2) ){
        memcpy(&aBuf[nBuf-2], "ate", 3);
        *pnBuf = nBuf - 2 + 3;
        ret = 1;
      }
      break;

    case 'b':
      if( nBuf>2 && 0==memcmp("bl", &aBuf[nBuf-2], 2) ){
        memcpy(&aBuf[nBuf-2], "ble", 3);
        *pnBuf = nBuf - 2 + 3;
        ret = 1;
      }
      break;

    case 'i':
      if( nBuf>2 && 0==memcmp("iz", &aBuf[nBuf-2], 2) ){
        memcpy(&aBuf[nBuf-2], "ize", 3);
        *pnBuf = nBuf - 2 + 3;
        ret = 1;
      }
      break;

  }
  return ret;
}